

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::InsideExpression::fromSyntax
          (Compilation *compilation,InsideExpressionSyntax *syntax,ASTContext *context)

{
  RangeListSyntax *pRVar1;
  Type *args;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar2;
  int iVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined4 extraout_var;
  InsideExpression *expr;
  Expression *pEVar6;
  Diagnostic *this;
  Diagnostic *pDVar7;
  EVP_PKEY_CTX *src;
  long extraout_RDX;
  long lVar8;
  ulong uVar9;
  UnaryExpression *unary;
  SourceRange SVar10;
  SourceRange range;
  string_view arg;
  string_view arg_00;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_ffffffffffffff08;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_e0;
  ExpressionSyntax *local_d0;
  pointer ppEStack_c8;
  undefined1 local_c0 [64];
  ExpressionSyntax *local_80;
  pointer local_78;
  undefined8 local_70;
  ExpressionSyntax local_68;
  SourceRange local_40;
  undefined8 *puVar5;
  
  local_80 = &local_68;
  local_78 = (pointer)0x0;
  local_70 = 5;
  pRVar1 = (syntax->ranges).ptr;
  uVar9 = (pRVar1->valueRanges).elements._M_extent._M_extent_value + 1;
  if (1 < uVar9) {
    uVar9 = uVar9 >> 1;
    lVar8 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((pRVar1->valueRanges).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar8));
      local_c0._0_8_ = *ppSVar4;
      SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
      emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_80,
                 (ExpressionSyntax **)local_c0);
      lVar8 = lVar8 + 0x30;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  local_c0._0_8_ = local_c0 + 0x18;
  local_c0._8_8_ = 0;
  local_c0._16_8_ = 5;
  expressions_00._M_extent._M_extent_value = (size_t)local_c0;
  expressions_00._M_ptr = local_78;
  local_d0 = local_80;
  ppEStack_c8 = local_78;
  bVar2 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0xc3,Unknown,true,false,true,
                     SUB81((syntax->expr).ptr,0),local_80,expressions_00,in_stack_ffffffffffffff08);
  iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                    ((SmallVectorBase<const_slang::ast::Expression_*> *)local_c0,
                     (EVP_PKEY_CTX *)compilation,src);
  puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  args = compilation->logicType;
  pEVar6 = (Expression *)*puVar5;
  local_e0._M_extent._M_extent_value = extraout_RDX - 1;
  local_e0._M_ptr = (pointer)(puVar5 + 1);
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,pEVar6,&local_e0,&local_40);
  if (bVar2) {
    pEVar6 = Expression::unwrapImplicitConversions((Expression *)*puVar5);
    if (((pEVar6->kind == UnaryOp) && (bVar2 = Expression::isParenthesized(pEVar6), !bVar2)) &&
       (pEVar6[1].kind == HierarchicalValue)) {
      SVar10.startLoc = *(SourceLocation *)&pEVar6[1].type;
      SVar10.endLoc = (SourceLocation)pEVar6[1].constant;
      this = ASTContext::addDiag(context,(DiagCode)0xc80007,SVar10);
      arg._M_str = "\'inside\' expression";
      arg._M_len = 0x13;
      pDVar7 = Diagnostic::operator<<(this,arg);
      SVar10 = parsing::Token::range(&syntax->inside);
      Diagnostic::operator<<(pDVar7,SVar10);
      range.endLoc = (expr->super_Expression).sourceRange.endLoc;
      range.startLoc = (SourceLocation)pEVar6[1].syntax[1].super_SyntaxNode.parent;
      pDVar7 = Diagnostic::addNote(this,(DiagCode)0xb00007,range);
      arg_00._M_str = "\'inside\' expression";
      arg_00._M_len = 0x13;
      Diagnostic::operator<<(pDVar7,arg_00);
      Diagnostic::addNote(this,(DiagCode)0xb10007,pEVar6->sourceRange);
    }
  }
  else {
    expr = (InsideExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  if ((ExpressionSyntax *)local_c0._0_8_ != (ExpressionSyntax *)(local_c0 + 0x18)) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (local_80 != &local_68) {
    operator_delete(local_80);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& InsideExpression::fromSyntax(Compilation& compilation,
                                         const InsideExpressionSyntax& syntax,
                                         const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto elemSyntax : syntax.ranges->valueRanges)
        expressions.push_back(elemSyntax);

    SmallVector<const Expression*> bound;
    bool bad =
        !bindMembershipExpressions(context, TokenKind::InsideKeyword, /* requireIntegral */ false,
                                   /* unwrapUnpacked */ true, /* allowTypeReferences */ false,
                                   /* allowValueRange */ true, *syntax.expr, expressions, bound);

    auto boundSpan = bound.copy(compilation);
    auto result = compilation.emplace<InsideExpression>(compilation.getLogicType(), *boundSpan[0],
                                                        boundSpan.subspan(1), syntax.sourceRange());
    if (bad)
        return badExpr(compilation, result);

    // Warn about `!x inside {y, z}` where they probably meant `!(x inside {y, z})`
    auto& lhs = boundSpan[0]->unwrapImplicitConversions();
    if (lhs.kind == ExpressionKind::UnaryOp && !lhs.isParenthesized() &&
        lhs.as<UnaryExpression>().op == UnaryOperator::LogicalNot) {

        auto& unary = lhs.as<UnaryExpression>();
        auto kindStr = "'inside' expression"sv;
        auto& diag = context.addDiag(diag::LogicalNotParentheses, unary.opRange);
        diag << kindStr << syntax.inside.range();

        SourceRange range(unary.operand().sourceRange.start(), result->sourceRange.end());
        diag.addNote(diag::NoteLogicalNotFix, range) << kindStr;
        diag.addNote(diag::NoteLogicalNotSilence, lhs.sourceRange);
    }

    return *result;
}